

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_graph.cc
# Opt level: O2

float GraphTask::macro_f(task_data *D)

{
  uint uVar1;
  ulong uVar2;
  size_t j;
  ulong uVar3;
  uint *puVar4;
  uint *puVar5;
  ulong uVar6;
  uint *puVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  uVar2 = D->K;
  puVar4 = D->confusion_matrix + uVar2 + 2;
  fVar9 = 0.0;
  fVar8 = 0.0;
  puVar5 = puVar4;
  for (uVar6 = 1; uVar6 <= uVar2; uVar6 = uVar6 + 1) {
    fVar10 = 0.0;
    fVar11 = 0.0;
    fVar12 = 0.0;
    fVar13 = 0.0;
    puVar7 = puVar4;
    for (uVar3 = 1; uVar3 <= uVar2; uVar3 = uVar3 + 1) {
      auVar16._4_4_ = 0;
      auVar16._0_4_ = *puVar7;
      auVar16._8_4_ = puVar5[uVar3 - 1];
      auVar16._12_4_ = 0;
      fVar10 = fVar10 + (float)(SUB168(auVar16 | _DAT_00233ca0,0) - (double)DAT_00233ca0);
      fVar11 = fVar11 + (float)(SUB168(auVar16 | _DAT_00233ca0,8) - DAT_00233ca0._8_8_);
      fVar12 = fVar12 + 0.0;
      fVar13 = fVar13 + 0.0;
      puVar7 = puVar7 + uVar2 + 1;
    }
    if ((fVar11 != 0.0) || (NAN(fVar11))) {
      uVar1 = D->confusion_matrix[(uVar2 + 2) * uVar6];
      fVar9 = fVar9 + 1.0;
      if (uVar1 != 0) {
        auVar14._0_4_ = (float)uVar1;
        auVar14._4_4_ = auVar14._0_4_;
        auVar14._8_4_ = auVar14._0_4_;
        auVar14._12_4_ = auVar14._0_4_;
        auVar15._4_4_ = fVar11;
        auVar15._0_4_ = fVar10;
        auVar15._8_4_ = fVar12;
        auVar15._12_4_ = fVar13;
        auVar15 = divps(auVar14,auVar15);
        fVar10 = auVar15._0_4_;
        fVar8 = fVar8 + ((fVar10 + fVar10) * auVar15._4_4_) / (auVar15._4_4_ + fVar10);
      }
    }
    puVar5 = puVar5 + uVar2 + 1;
    puVar4 = puVar4 + 1;
  }
  return fVar8 / fVar9;
}

Assistant:

float macro_f(task_data& D)
{
  float total_f1 = 0.;
  float count_f1 = 0.;
  for (size_t k = 1; k <= D.K; k++)
  {
    float trueC = 0.;
    float predC = 0.;
    for (size_t j = 1; j <= D.K; j++)
    {
      trueC += (float)D.confusion_matrix[IDX(k, j)];
      predC += (float)D.confusion_matrix[IDX(j, k)];
    }
    if (trueC == 0)
      continue;
    float correctC = (float)D.confusion_matrix[IDX(k, k)];
    count_f1++;
    if (correctC > 0)
    {
      float pre = correctC / predC;
      float rec = correctC / trueC;
      total_f1 += 2 * pre * rec / (pre + rec);
    }
  }
  return total_f1 / count_f1;
}